

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

QPolygonF * __thiscall QPainterPath::toFillPolygon(QPainterPath *this,QTransform *matrix)

{
  long lVar1;
  bool bVar2;
  QList<QPointF> *this_00;
  qsizetype qVar3;
  QPolygonF *in_RDI;
  long in_FS_OFFSET;
  int i;
  QPolygonF *polygon;
  QPointF first;
  QList<QPolygonF> flats;
  parameter_type in_stack_ffffffffffffff88;
  QList<QPointF> *in_stack_ffffffffffffff90;
  QPolygonF *this_01;
  int local_54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  toSubpathPolygons((QPainterPath *)&DAT_aaaaaaaaaaaaaaaa,(QTransform *)&DAT_aaaaaaaaaaaaaaaa);
  (this_01->super_QList<QPointF>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (this_01->super_QList<QPointF>).d.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
  (this_01->super_QList<QPointF>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QPolygonF::QPolygonF((QPolygonF *)0x5bd7d9);
  bVar2 = QList<QPolygonF>::isEmpty((QList<QPolygonF> *)0x5bd7e3);
  if (!bVar2) {
    QList<QPolygonF>::first((QList<QPolygonF> *)in_stack_ffffffffffffff90);
    QList<QPointF>::first(in_stack_ffffffffffffff90);
    local_54 = 0;
    while( true ) {
      this_00 = (QList<QPointF> *)(long)local_54;
      qVar3 = QList<QPolygonF>::size((QList<QPolygonF> *)&stack0xffffffffffffffe0);
      if (qVar3 <= (long)this_00) break;
      QList<QPolygonF>::at((QList<QPolygonF> *)this_00,(qsizetype)in_stack_ffffffffffffff88);
      QList<QPointF>::operator+=(this_00,(QList<QPointF> *)in_stack_ffffffffffffff88);
      QList<QPolygonF>::at((QList<QPolygonF> *)this_00,(qsizetype)in_stack_ffffffffffffff88);
      bVar2 = QPolygonF::isClosed(this_01);
      if (!bVar2) {
        QList<QPolygonF>::at((QList<QPolygonF> *)this_00,(qsizetype)in_stack_ffffffffffffff88);
        QList<QPointF>::first(this_00);
        QList<QPointF>::operator+=(this_00,in_stack_ffffffffffffff88);
      }
      if (0 < local_54) {
        QList<QPointF>::operator+=(this_00,in_stack_ffffffffffffff88);
      }
      local_54 = local_54 + 1;
    }
  }
  QList<QPolygonF>::~QList((QList<QPolygonF> *)0x5bd90e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QPainterPath::toFillPolygon(const QTransform &matrix) const
{
    const QList<QPolygonF> flats = toSubpathPolygons(matrix);
    QPolygonF polygon;
    if (flats.isEmpty())
        return polygon;
    QPointF first = flats.first().first();
    for (int i=0; i<flats.size(); ++i) {
        polygon += flats.at(i);
        if (!flats.at(i).isClosed())
            polygon += flats.at(i).first();
        if (i > 0)
            polygon += first;
    }
    return polygon;
}